

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

void __thiscall
icu_63::TransliteratorRegistry::registerSTV
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant)

{
  int iVar1;
  int8_t iVar2;
  uint uVar3;
  uint uVar4;
  Hashtable *this_00;
  UnicodeString *pUVar5;
  int32_t size;
  ConstChar16Ptr *srcChars;
  UErrorCode status;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  UnicodeString *local_58;
  UChar *local_50;
  UChar *local_40;
  
  status = U_ZERO_ERROR;
  local_58 = target;
  this_00 = (Hashtable *)Hashtable::get(&this->specDAG,source);
  if (this_00 == (Hashtable *)0x0) {
    srcChars = &local_60;
    local_60.p_ = L"Any";
    iVar2 = icu_63::UnicodeString::compare(source,srcChars,3);
    local_40 = local_60.p_;
    if (iVar2 == '\0') {
      size = 0x7d;
    }
    else {
      srcChars = &local_68;
      local_68.p_ = L"Lat";
      iVar2 = icu_63::UnicodeString::compare(source,srcChars,3);
      local_50 = local_68.p_;
      size = 3;
      if (iVar2 == '\0') {
        size = 0x17;
      }
    }
    this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)srcChars);
    if (this_00 == (Hashtable *)0x0) {
      return;
    }
    Hashtable::Hashtable(this_00,'\x01',size,&status);
    if (U_ZERO_ERROR < status) {
      return;
    }
    Hashtable::put(&this->specDAG,source,this_00,&status);
  }
  pUVar5 = variant;
  uVar3 = UVector::indexOf(&this->variantList,variant,0);
  if ((int)uVar3 < 0) {
    if (0x1e < (this->variantList).count) {
      return;
    }
    pUVar5 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar5);
    if (pUVar5 == (UnicodeString *)0x0) {
      return;
    }
    icu_63::UnicodeString::UnicodeString(pUVar5,variant);
    UVector::addElement(&this->variantList,pUVar5,&status);
    if (U_ZERO_ERROR < status) {
      return;
    }
    iVar1 = (this->variantList).count;
    if (iVar1 < 1) {
      return;
    }
    uVar3 = iVar1 - 1;
  }
  pUVar5 = local_58;
  uVar4 = Hashtable::geti(this_00,local_58);
  Hashtable::puti(this_00,pUVar5,uVar4 | 1 << (uVar3 & 0x1f),&status);
  return;
}

Assistant:

void TransliteratorRegistry::registerSTV(const UnicodeString& source,
                                         const UnicodeString& target,
                                         const UnicodeString& variant) {
    // assert(source.length() > 0);
    // assert(target.length() > 0);
    UErrorCode status = U_ZERO_ERROR;
    Hashtable *targets = (Hashtable*) specDAG.get(source);
    if (targets == 0) {
        int32_t size = 3;
        if (source.compare(ANY,3) == 0) {
            size = ANY_TARGETS_INIT_SIZE;
        } else if (source.compare(LAT,3) == 0) {
            size = LAT_TARGETS_INIT_SIZE;
        }
        targets = new Hashtable(TRUE, size, status);
        if (U_FAILURE(status) || targets == NULL) {
            return;
        }
        specDAG.put(source, targets, status);
    }
    int32_t variantListIndex = variantList.indexOf((void*) &variant, 0);
    if (variantListIndex < 0) {
        if (variantList.size() >= VARIANT_LIST_MAX_SIZE) {
            // can't handle any more variants
            return;
        }
        UnicodeString *variantEntry = new UnicodeString(variant);
        if (variantEntry != NULL) {
            variantList.addElement(variantEntry, status);
            if (U_SUCCESS(status)) {
                variantListIndex = variantList.size() - 1;
            }
        }
        if (variantListIndex < 0) {
            return;
        }
    }
    uint32_t addMask = 1 << variantListIndex;
    uint32_t varMask = targets->geti(target);
    targets->puti(target, varMask | addMask, status);
}